

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi_custom_type.cpp
# Opt level: O2

void CAPIRegisterCustomType
               (duckdb_connection connection,char *name,duckdb_type duckdb_type,
               duckdb_state expected_outcome)

{
  duckdb_logical_type p_Var1;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  duckdb_logical_type base_type;
  duckdb_state status;
  duckdb_state expected_outcome_local;
  SourceLineInfo local_c0;
  BinaryExpr<const_duckdb_state_&,_const_duckdb_state_&> local_b0;
  AssertionHandler catchAssertionHandler;
  StringRef local_38;
  
  expected_outcome_local = duckdb_type;
  p_Var1 = (duckdb_logical_type)
           duckdb_create_logical_type
                     ((ulong)name & 0xffffffff,name,CONCAT44(in_register_00000014,duckdb_type),
                      CONCAT44(in_register_0000000c,expected_outcome));
  base_type = p_Var1;
  duckdb_logical_type_set_alias(p_Var1,"NUMBER");
  status = duckdb_register_logical_type(connection,p_Var1,0);
  local_b0.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x438f58;
  local_b0.super_ITransientExpression.m_isBinaryExpression = true;
  local_b0.super_ITransientExpression.m_result = false;
  local_b0.super_ITransientExpression._10_6_ = 0;
  local_c0.file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/api/capi/capi_custom_type.cpp"
  ;
  local_c0.line = 0xf;
  Catch::StringRef::StringRef(&local_38,"status == expected_outcome");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_b0,&local_c0,local_38,Normal);
  local_c0.file = (char *)&status;
  Catch::ExprLhs<duckdb_state_const&>::operator==
            (&local_b0,(ExprLhs<duckdb_state_const&> *)&local_c0,&expected_outcome_local);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_b0.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_b0.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  duckdb_destroy_logical_type(&base_type);
  duckdb_destroy_logical_type(&base_type);
  duckdb_destroy_logical_type(0);
  return;
}

Assistant:

static void CAPIRegisterCustomType(duckdb_connection connection, const char *name, duckdb_type duckdb_type,
                                   duckdb_state expected_outcome) {
	duckdb_state status;

	auto base_type = duckdb_create_logical_type(duckdb_type);
	duckdb_logical_type_set_alias(base_type, name);

	status = duckdb_register_logical_type(connection, base_type, nullptr);
	REQUIRE(status == expected_outcome);

	duckdb_destroy_logical_type(&base_type);
	duckdb_destroy_logical_type(&base_type);
	duckdb_destroy_logical_type(nullptr);
}